

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::SeparatorEx(ImGuiSeparatorFlags flags)

{
  bool bVar1;
  uint in_EDI;
  float _x;
  float _x_00;
  bool item_visible;
  ImRect bb_1;
  ImGuiColumns *columns;
  float x2;
  float x1;
  ImRect bb;
  float y2;
  float y1;
  float thickness_layout;
  float thickness_draw;
  ImGuiContext *g;
  ImGuiWindow *window;
  ImGuiColumns *local_b8;
  undefined8 in_stack_ffffffffffffff50;
  ImDrawList *pIVar2;
  undefined4 in_stack_ffffffffffffff58;
  float in_stack_ffffffffffffff5c;
  float in_stack_ffffffffffffff60;
  ImGuiID in_stack_ffffffffffffff64;
  ImVec2 in_stack_ffffffffffffff68;
  ImVec2 local_90;
  ImVec2 local_88;
  float in_stack_ffffffffffffff80;
  float in_stack_ffffffffffffff84;
  float in_stack_ffffffffffffff88;
  float in_stack_ffffffffffffff8c;
  ImVec2 *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  ImVec2 in_stack_ffffffffffffffa0;
  ImVec2 local_58;
  ImVec2 local_50;
  ImVec2 local_48;
  ImVec2 local_40;
  ImRect local_38;
  float local_28;
  float local_24;
  float local_20;
  float local_1c;
  ImGuiContext *local_18;
  ImGuiWindow *local_10;
  uint local_4;
  
  local_4 = in_EDI;
  local_10 = GetCurrentWindow();
  if ((local_10->SkipItems & 1U) == 0) {
    local_18 = GImGui;
    bVar1 = ImIsPowerOfTwo(local_4 & 3);
    if (!bVar1) {
      __assert_fail("ImIsPowerOfTwo(flags & (ImGuiSeparatorFlags_Horizontal | ImGuiSeparatorFlags_Vertical))"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui_widgets.cpp"
                    ,0x4fd,"void ImGui::SeparatorEx(ImGuiSeparatorFlags)");
    }
    local_1c = 1.0;
    local_20 = 0.0;
    if ((local_4 & 2) == 0) {
      if ((local_4 & 1) != 0) {
        _x_00 = (local_10->Pos).x;
        _x = (local_10->Pos).x + (local_10->Size).x;
        bVar1 = ImVector<ImGuiGroupData>::empty(&(local_10->DC).GroupStack);
        if (!bVar1) {
          _x_00 = (local_10->DC).Indent.x + _x_00;
        }
        if ((local_4 & 4) == 0) {
          local_b8 = (ImGuiColumns *)0x0;
        }
        else {
          local_b8 = (local_10->DC).CurrentColumns;
        }
        if (local_b8 != (ImGuiColumns *)0x0) {
          PushColumnsBackground();
        }
        ImVec2::ImVec2(&local_88,_x_00,(local_10->DC).CursorPos.y);
        ImVec2::ImVec2(&local_90,_x,(local_10->DC).CursorPos.y + local_1c);
        ImRect::ImRect((ImRect *)&stack0xffffffffffffff80,&local_88,&local_90);
        ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff68,0.0,local_20);
        ItemSize((ImVec2 *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                 in_stack_ffffffffffffff5c);
        bVar1 = ItemAdd((ImRect *)in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,
                        (ImRect *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
        if (bVar1) {
          ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff5c,in_stack_ffffffffffffff88,
                         in_stack_ffffffffffffff84);
          GetColorU32((ImGuiCol)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                      (float)in_stack_ffffffffffffff50);
          ImDrawList::AddLine((ImDrawList *)in_stack_ffffffffffffffa0,(ImVec2 *)CONCAT44(_x_00,_x),
                              (ImVec2 *)local_b8,(ImU32)in_stack_ffffffffffffff8c,
                              in_stack_ffffffffffffff88);
          if ((local_18->LogEnabled & 1U) != 0) {
            LogRenderedText((ImVec2 *)local_b8,
                            (char *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                            (char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
          }
        }
        if (local_b8 != (ImGuiColumns *)0x0) {
          PopColumnsBackground();
          local_b8->LineMinY = (local_10->DC).CursorPos.y;
        }
      }
    }
    else {
      local_24 = (local_10->DC).CursorPos.y;
      local_28 = (local_10->DC).CursorPos.y + (local_10->DC).CurrLineSize.y;
      ImVec2::ImVec2(&local_40,(local_10->DC).CursorPos.x,local_24);
      ImVec2::ImVec2(&local_48,(local_10->DC).CursorPos.x + local_1c,local_28);
      ImRect::ImRect(&local_38,&local_40,&local_48);
      ImVec2::ImVec2(&local_50,local_20,0.0);
      ItemSize((ImVec2 *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
               in_stack_ffffffffffffff5c);
      bVar1 = ItemAdd((ImRect *)in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,
                      (ImRect *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
      if (bVar1) {
        pIVar2 = local_10->DrawList;
        ImVec2::ImVec2(&local_58,local_38.Min.x,local_38.Min.y);
        ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffa0,local_38.Min.x,local_38.Max.y);
        GetColorU32((ImGuiCol)((ulong)pIVar2 >> 0x20),SUB84(pIVar2,0));
        ImDrawList::AddLine((ImDrawList *)in_stack_ffffffffffffffa0,
                            (ImVec2 *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                            in_stack_ffffffffffffff90,(ImU32)in_stack_ffffffffffffff8c,
                            in_stack_ffffffffffffff88);
        if ((local_18->LogEnabled & 1U) != 0) {
          LogText(" |");
        }
      }
    }
  }
  return;
}

Assistant:

void ImGui::SeparatorEx(ImGuiSeparatorFlags flags)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return;

    ImGuiContext& g = *GImGui;
    IM_ASSERT(ImIsPowerOfTwo(flags & (ImGuiSeparatorFlags_Horizontal | ImGuiSeparatorFlags_Vertical)));   // Check that only 1 option is selected

    float thickness_draw = 1.0f;
    float thickness_layout = 0.0f;
    if (flags & ImGuiSeparatorFlags_Vertical)
    {
        // Vertical separator, for menu bars (use current line height). Not exposed because it is misleading and it doesn't have an effect on regular layout.
        float y1 = window->DC.CursorPos.y;
        float y2 = window->DC.CursorPos.y + window->DC.CurrLineSize.y;
        const ImRect bb(ImVec2(window->DC.CursorPos.x, y1), ImVec2(window->DC.CursorPos.x + thickness_draw, y2));
        ItemSize(ImVec2(thickness_layout, 0.0f));
        if (!ItemAdd(bb, 0))
            return;

        // Draw
        window->DrawList->AddLine(ImVec2(bb.Min.x, bb.Min.y), ImVec2(bb.Min.x, bb.Max.y), GetColorU32(ImGuiCol_Separator));
        if (g.LogEnabled)
            LogText(" |");
    }
    else if (flags & ImGuiSeparatorFlags_Horizontal)
    {
        // Horizontal Separator
        float x1 = window->Pos.x;
        float x2 = window->Pos.x + window->Size.x;
        if (!window->DC.GroupStack.empty())
            x1 += window->DC.Indent.x;

        ImGuiColumns* columns = (flags & ImGuiSeparatorFlags_SpanAllColumns) ? window->DC.CurrentColumns : NULL;
        if (columns)
            PushColumnsBackground();

        // We don't provide our width to the layout so that it doesn't get feed back into AutoFit
        const ImRect bb(ImVec2(x1, window->DC.CursorPos.y), ImVec2(x2, window->DC.CursorPos.y + thickness_draw));
        ItemSize(ImVec2(0.0f, thickness_layout));
        const bool item_visible = ItemAdd(bb, 0);
        if (item_visible)
        {
            // Draw
            window->DrawList->AddLine(bb.Min, ImVec2(bb.Max.x, bb.Min.y), GetColorU32(ImGuiCol_Separator));
            if (g.LogEnabled)
                LogRenderedText(&bb.Min, "--------------------------------");
        }
        if (columns)
        {
            PopColumnsBackground();
            columns->LineMinY = window->DC.CursorPos.y;
        }
    }
}